

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ImDrawVert *pIVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  long lVar10;
  unsigned_short *puVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ImVec2 triangle [3];
  undefined8 local_98;
  ImVec2 local_88;
  ImVec2 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar11 = (unsigned_short *)0x0;
  }
  else {
    puVar11 = (draw_list->IdxBuffer).Data;
  }
  uVar4 = draw_cmd->VtxOffset;
  pIVar6 = (draw_list->VtxBuffer).Data;
  uVar2._0_4_ = (draw_cmd->ClipRect).x;
  uVar2._4_4_ = (draw_cmd->ClipRect).y;
  uVar3._0_4_ = (draw_cmd->ClipRect).z;
  uVar3._4_4_ = (draw_cmd->ClipRect).w;
  uVar5 = out_draw_list->Flags;
  out_draw_list->Flags = uVar5 & 0xfffffffe;
  uVar9 = draw_cmd->IdxOffset;
  uVar12 = (ulong)uVar9;
  if (uVar9 < draw_cmd->ElemCount + uVar9) {
    uStack_50 = 0;
    uStack_40 = 0;
    auVar18 = _DAT_0018bab0;
    auVar19 = _DAT_00181260;
    local_58 = uVar2;
    local_48 = uVar3;
    do {
      local_78[0].x = 0.0;
      local_78[0].y = 0.0;
      local_78[1].x = 0.0;
      local_78[1].y = 0.0;
      local_78[2].x = 0.0;
      local_78[2].y = 0.0;
      lVar10 = 0;
      uVar2._0_4_ = auVar19._0_4_;
      uVar3._0_4_ = auVar19._4_4_;
      uVar13 = auVar19._8_4_;
      uVar14 = auVar19._12_4_;
      uVar2._4_4_ = auVar18._0_4_;
      uVar3._4_4_ = auVar18._4_4_;
      uVar15 = auVar18._8_4_;
      uVar16 = auVar18._12_4_;
      do {
        uVar1 = (uVar12 & 0xffffffff) + lVar10;
        uVar9 = (uint)uVar1;
        if (puVar11 != (unsigned_short *)0x0) {
          uVar9 = (uint)puVar11[uVar1 & 0xffffffff];
        }
        IVar7 = pIVar6[(ulong)uVar4 + (ulong)uVar9].pos;
        local_78[lVar10] = IVar7;
        auVar17._8_8_ = 0;
        auVar17._0_4_ = IVar7.x;
        auVar17._4_4_ = IVar7.y;
        auVar18._4_4_ = (float)uVar3;
        auVar18._0_4_ = (float)uVar2;
        auVar18._8_4_ = uVar13;
        auVar18._12_4_ = uVar14;
        auVar19 = minps(auVar17,auVar18);
        auVar8._4_4_ = uVar3._4_4_;
        auVar8._0_4_ = uVar2._4_4_;
        auVar8._8_4_ = uVar15;
        auVar8._12_4_ = uVar16;
        auVar18 = maxps(auVar17,auVar8);
        lVar10 = lVar10 + 1;
        uVar2._0_4_ = auVar19._0_4_;
        uVar3._0_4_ = auVar19._4_4_;
        uVar13 = auVar19._8_4_;
        uVar14 = auVar19._12_4_;
        uVar2._4_4_ = auVar18._0_4_;
        uVar3._4_4_ = auVar18._4_4_;
        uVar15 = auVar18._8_4_;
        uVar16 = auVar18._12_4_;
      } while (lVar10 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(out_draw_list,local_78,3,0xff00ffff,true,1.0);
      }
      uVar12 = (uVar12 & 0xffffffff) + 3;
    } while ((uint)uVar12 < draw_cmd->ElemCount + draw_cmd->IdxOffset);
    local_88.y = (float)(int)(float)uVar3;
    local_88.x = (float)(int)(float)uVar2;
    local_98 = CONCAT44((float)(int)uVar3._4_4_,(float)(int)uVar2._4_4_);
    uVar2._0_4_ = (float)local_58;
    uVar2._4_4_ = local_58._4_4_;
    uVar3._0_4_ = (float)local_48;
    uVar3._4_4_ = local_48._4_4_;
  }
  if (show_aabb) {
    local_78[0].y = (float)(int)uVar2._4_4_;
    local_78[0].x = (float)(int)(float)uVar2;
    local_78[3] = (ImVec2)CONCAT44((float)(int)uVar3._4_4_,(float)(int)(float)uVar3);
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffff00ff,0.0,0xf,1.0);
    local_78[0] = local_88;
    local_78[3].x = (float)(undefined4)local_98;
    local_78[3].y = (float)local_98._4_4_;
    ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffffff00,0.0,0xf,1.0);
  }
  out_draw_list->Flags = uVar5;
  return;
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}